

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdbusplatformmenu_p.cpp
# Opt level: O3

void QDBusPlatformMenu::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  long *plVar3;
  undefined8 *puVar4;
  InterfaceType *pIVar5;
  int iVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<QDBusMenuItemKeys> local_70;
  QArrayDataPointer<QDBusMenuItem> local_58;
  undefined1 local_40 [8];
  QDBusMenuItemKeys *local_38;
  QArrayDataPointer<QDBusMenuItem> *local_30;
  QArrayDataPointer<QDBusMenuItemKeys> *local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c != RegisterMethodArgumentMetaType) {
    if (_c == IndexOfMethod) {
      pcVar1 = *_a[1];
      lVar2 = *(long *)((long)_a[1] + 8);
      if (pcVar1 == updated && lVar2 == 0) {
        *(undefined4 *)*_a = 0;
      }
      else if (pcVar1 == propertiesUpdated && lVar2 == 0) {
        *(undefined4 *)*_a = 1;
      }
      else if (pcVar1 == popupRequested && lVar2 == 0) {
        *(undefined4 *)*_a = 2;
      }
    }
    else if (_c == InvokeMetaMethod) {
      if (_id == 2) {
        local_40._4_4_ = *_a[1];
        local_40._0_4_ = *_a[2];
        iVar6 = 2;
      }
      else {
        if (_id == 1) {
          plVar3 = (long *)_a[1];
          local_58.d = (Data *)*plVar3;
          local_58.ptr = (QDBusMenuItem *)plVar3[1];
          local_58.size = plVar3[2];
          if (local_58.d != (Data *)0x0) {
            LOCK();
            ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          plVar3 = (long *)_a[2];
          local_70.d = (Data *)*plVar3;
          local_70.ptr = (QDBusMenuItemKeys *)plVar3[1];
          local_70.size = plVar3[2];
          if (local_70.d != (Data *)0x0) {
            LOCK();
            ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_38 = (QDBusMenuItemKeys *)0x0;
          local_30 = &local_58;
          local_28 = &local_70;
          QMetaObject::activate(_o,&staticMetaObject,1,&local_38);
          QArrayDataPointer<QDBusMenuItemKeys>::~QArrayDataPointer(&local_70);
          QArrayDataPointer<QDBusMenuItem>::~QArrayDataPointer(&local_58);
          goto LAB_00641239;
        }
        if (_id != 0) goto LAB_00641239;
        local_40._4_4_ = *_a[1];
        local_40._0_4_ = *_a[2];
        iVar6 = 0;
      }
      local_28 = (QArrayDataPointer<QDBusMenuItemKeys> *)local_40;
      local_30 = (QArrayDataPointer<QDBusMenuItem> *)(local_40 + 4);
      local_38 = (QDBusMenuItemKeys *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,iVar6,&local_38);
    }
    goto LAB_00641239;
  }
  if (_id == 1) {
    puVar4 = (undefined8 *)*_a;
    if (*_a[1] == 0) {
      pIVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QDBusMenuItem>_>::metaType;
    }
    else {
      if (*_a[1] != 1) goto LAB_00641134;
      pIVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QDBusMenuItemKeys>_>::metaType;
    }
    *puVar4 = pIVar5;
  }
  else {
    puVar4 = (undefined8 *)*_a;
LAB_00641134:
    *puVar4 = 0;
  }
LAB_00641239:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusPlatformMenu::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDBusPlatformMenu *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->updated((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 1: _t->propertiesUpdated((*reinterpret_cast< std::add_pointer_t<QDBusMenuItemList>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QDBusMenuItemKeysList>>(_a[2]))); break;
        case 2: _t->popupRequested((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<uint>>(_a[2]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusMenuItemKeysList >(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusMenuItemList >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDBusPlatformMenu::*)(uint , int )>(_a, &QDBusPlatformMenu::updated, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDBusPlatformMenu::*)(QDBusMenuItemList , QDBusMenuItemKeysList )>(_a, &QDBusPlatformMenu::propertiesUpdated, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDBusPlatformMenu::*)(int , uint )>(_a, &QDBusPlatformMenu::popupRequested, 2))
            return;
    }
}